

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool re2::RE2::Extract(StringPiece *text,RE2 *re,StringPiece *rewrite,string *out)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  StringPiece vec [17];
  undefined8 uStack_140;
  StringPiece local_138 [17];
  
  lVar3 = 8;
  do {
    *(undefined8 *)((long)&uStack_140 + lVar3) = 0;
    *(undefined4 *)((long)&local_138[0].ptr_ + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x118);
  if ((long)rewrite->length_ < 1) {
    uVar7 = 0;
  }
  else {
    pcVar5 = rewrite->ptr_;
    pcVar4 = pcVar5 + rewrite->length_;
    uVar7 = 0;
    do {
      if (*pcVar5 == '\\') {
        pcVar5 = pcVar5 + 1;
        uVar6 = 0xffffffcf;
        if (pcVar5 < pcVar4) {
          uVar6 = (int)*pcVar5 - 0x30;
        }
        uVar8 = uVar7;
        if ((int)uVar7 < (int)uVar6) {
          uVar8 = uVar6;
        }
        if (uVar6 < 10) {
          uVar7 = uVar8;
        }
      }
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 < pcVar4);
  }
  if (uVar7 < 0x11) {
    bVar2 = false;
    bVar1 = Match(re,text,0,text->length_,UNANCHORED,local_138,uVar7 + 1);
    if (bVar1) {
      out->_M_string_length = 0;
      *(out->_M_dataplus)._M_p = '\0';
      bVar2 = Rewrite(re,out,rewrite,local_138,uVar7 + 1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RE2::Extract(const StringPiece &text,
                 const RE2& re,
                 const StringPiece &rewrite,
                 string *out) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > arraysize(vec))
    return false;

  if (!re.Match(text, 0, text.size(), UNANCHORED, vec, nvec))
    return false;

  out->clear();
  return re.Rewrite(out, rewrite, vec, nvec);
}